

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O3

bool helics::fileops::looksLikeFile(string_view configString)

{
  bool bVar1;
  void *pvVar2;
  char *in_RDX;
  char *extraout_RDX;
  bool bVar3;
  fileops *this;
  size_type __n;
  string_view tomlString;
  string_view jsonString;
  
  tomlString._M_len = configString._M_str;
  this = (fileops *)configString._M_len;
  tomlString._M_str = in_RDX;
  bVar1 = hasTomlExtension(this,tomlString);
  bVar3 = true;
  if ((!bVar1) &&
     (jsonString._M_str = extraout_RDX, jsonString._M_len = (size_t)tomlString._M_len,
     bVar1 = hasJsonExtension(this,jsonString), !bVar1)) {
    if ((this != (fileops *)0x0) &&
       (pvVar2 = memchr(tomlString._M_len,0x7b,(size_t)this),
       pvVar2 != (void *)0x0 && (long)pvVar2 - (long)tomlString._M_len != -1)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool looksLikeFile(std::string_view configString)
{
    if (helics::fileops::hasTomlExtension(configString)) {
        return true;
    }
    if ((helics::fileops::hasJsonExtension(configString)) ||
        (configString.find_first_of('{') != std::string_view::npos)) {
        return true;
    }
    return false;
}